

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

RunningSection * __thiscall
Catch::RunningSection::findOrAddSubSection(RunningSection *this,string *name,bool *changed)

{
  __type _Var1;
  RunningSection *this_00;
  pointer ppRVar2;
  RunningSection *subSection;
  
  ppRVar2 = (this->m_subSections).
            super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppRVar2 ==
        (this->m_subSections).
        super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (RunningSection *)operator_new(0x48);
      RunningSection(this_00,this,name);
      subSection = this_00;
      std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>::push_back
                (&this->m_subSections,&subSection);
      this->m_state = Branch;
      *changed = true;
      return subSection;
    }
    std::__cxx11::string::string((string *)&subSection,(string *)&(*ppRVar2)->m_name);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &subSection,name);
    std::__cxx11::string::~string((string *)&subSection);
    if (_Var1) break;
    ppRVar2 = ppRVar2 + 1;
  }
  return *ppRVar2;
}

Assistant:

RunningSection* findOrAddSubSection( std::string const& name, bool& changed ) {
            for(    SubSections::const_iterator it = m_subSections.begin();
                    it != m_subSections.end();
                    ++it)
                if( (*it)->getName() == name )
                    return *it;
            RunningSection* subSection = new RunningSection( this, name );
            m_subSections.push_back( subSection );
            m_state = Branch;
            changed = true;
            return subSection;
        }